

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

size_t embree::mapThreadID(size_t threadID)

{
  ulong *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  int i_1;
  int iVar5;
  undefined8 *puVar6;
  long *plVar7;
  pthread_t __th;
  int j;
  iterator iVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  uint __len;
  int i;
  string __str;
  string cpu;
  Lock<embree::MutexSys> lock;
  cpu_set_t set;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  ulong local_2e8;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  MutexSys *local_260;
  char local_258;
  size_t local_250;
  cpu_set_t local_248 [4];
  
  local_260 = (MutexSys *)&mutex;
  local_258 = '\x01';
  MutexSys::lock((MutexSys *)&mutex);
  if (DAT_002d1f88._M_current == threadIDs) {
    local_2e8 = 0;
    local_250 = threadID;
    do {
      std::fstream::fstream((istream *)local_248);
      local_2e0 = local_2d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e0,"/sys/devices/system/cpu/cpu","");
      uVar10 = -local_2e8;
      if (0 < (long)local_2e8) {
        uVar10 = local_2e8;
      }
      __len = 1;
      if (9 < uVar10) {
        uVar11 = uVar10;
        uVar4 = 4;
        do {
          __len = uVar4;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_001dd4dd;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_001dd4dd;
          }
          if (uVar11 < 10000) goto LAB_001dd4dd;
          bVar3 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar4 = __len + 4;
        } while (bVar3);
        __len = __len + 1;
      }
LAB_001dd4dd:
      lVar12 = (long)local_2e8 >> 0x3f;
      local_2c0 = local_2b0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_2c0,(char)__len - (char)((long)local_2e8 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_2c0 - lVar12),__len,uVar10);
      uVar10 = 0xf;
      if (local_2e0 != local_2d0) {
        uVar10 = local_2d0[0];
      }
      if (uVar10 < (ulong)(local_2b8 + local_2d8)) {
        uVar10 = 0xf;
        if (local_2c0 != local_2b0) {
          uVar10 = local_2b0[0];
        }
        if (uVar10 < (ulong)(local_2b8 + local_2d8)) goto LAB_001dd56d;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2e0);
      }
      else {
LAB_001dd56d:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_2c0);
      }
      puVar1 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar1) {
        local_2f8 = *puVar1;
        uStack_2f0 = *(undefined4 *)(puVar6 + 3);
        uStack_2ec = *(undefined4 *)((long)puVar6 + 0x1c);
        local_308 = &local_2f8;
      }
      else {
        local_2f8 = *puVar1;
        local_308 = (ulong *)*puVar6;
      }
      local_300 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      local_280 = local_270;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_280,"/topology/thread_siblings_list","");
      uVar10 = 0xf;
      if (local_308 != &local_2f8) {
        uVar10 = local_2f8;
      }
      if (uVar10 < (ulong)(local_278 + local_300)) {
        uVar10 = 0xf;
        if (local_280 != local_270) {
          uVar10 = local_270[0];
        }
        if (uVar10 < (ulong)(local_278 + local_300)) goto LAB_001dd635;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_308);
      }
      else {
LAB_001dd635:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_280);
      }
      puVar2 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar2) {
        local_290 = *puVar2;
        uStack_288 = puVar6[3];
        local_2a0 = &local_290;
      }
      else {
        local_290 = *puVar2;
        local_2a0 = (undefined8 *)*puVar6;
      }
      local_298 = puVar6[1];
      *puVar6 = puVar2;
      puVar6[1] = 0;
      *(undefined1 *)puVar2 = 0;
      if (local_280 != local_270) {
        operator_delete(local_280);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0);
      }
      if (local_2e0 != local_2d0) {
        operator_delete(local_2e0);
      }
      std::fstream::open((char *)local_248,(_Ios_Openmode)local_2a0);
      if ((*(byte *)((long)local_248[0].__bits + *(long *)(local_248[0].__bits[0] - 0x18) + 0x20) &
          5) != 0) goto LAB_001dd85b;
      while (plVar7 = (long *)std::istream::operator>>((istream *)local_248,(int *)&local_2e0),
            (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
        lVar12 = (long)DAT_002d1f88._M_current - (long)threadIDs >> 5;
        puVar9 = threadIDs;
        if (0 < lVar12) {
          puVar9 = (unsigned_long *)
                   (((long)DAT_002d1f88._M_current - (long)threadIDs & 0xffffffffffffffe0U) +
                   (long)threadIDs);
          lVar12 = lVar12 + 1;
          iVar8._M_current = threadIDs + 2;
          do {
            if ((int)local_2e0 == (int)iVar8._M_current[-2]) {
              iVar8._M_current = iVar8._M_current + -2;
              goto LAB_001dd7e5;
            }
            if ((int)local_2e0 == (int)iVar8._M_current[-1]) {
              iVar8._M_current = iVar8._M_current + -1;
              goto LAB_001dd7e5;
            }
            if ((int)local_2e0 == (int)*iVar8._M_current) goto LAB_001dd7e5;
            if ((int)local_2e0 == (int)iVar8._M_current[1]) {
              iVar8._M_current = iVar8._M_current + 1;
              goto LAB_001dd7e5;
            }
            lVar12 = lVar12 + -1;
            iVar8._M_current = iVar8._M_current + 4;
          } while (1 < lVar12);
        }
        lVar12 = (long)DAT_002d1f88._M_current - (long)puVar9 >> 3;
        if (lVar12 == 1) {
LAB_001dd7c6:
          iVar8._M_current = puVar9;
          if ((int)local_2e0 != (int)*puVar9) {
            iVar8._M_current = DAT_002d1f88._M_current;
          }
        }
        else if (lVar12 == 2) {
LAB_001dd7ba:
          iVar8._M_current = puVar9;
          if ((int)local_2e0 != (int)*puVar9) {
            puVar9 = puVar9 + 1;
            goto LAB_001dd7c6;
          }
        }
        else {
          iVar8._M_current = DAT_002d1f88._M_current;
          if ((lVar12 == 3) && (iVar8._M_current = puVar9, (int)local_2e0 != (int)*puVar9)) {
            puVar9 = puVar9 + 1;
            goto LAB_001dd7ba;
          }
        }
LAB_001dd7e5:
        if (iVar8._M_current == DAT_002d1f88._M_current) {
          local_308 = (ulong *)(long)(int)local_2e0;
          if (DAT_002d1f88._M_current == DAT_002d1f90) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&threadIDs,
                       DAT_002d1f88,(unsigned_long *)&local_308);
          }
          else {
            *DAT_002d1f88._M_current = (unsigned_long)local_308;
            DAT_002d1f88._M_current = DAT_002d1f88._M_current + 1;
          }
        }
        iVar5 = std::istream::peek();
        if (iVar5 == 0x2c) {
          std::istream::ignore();
        }
      }
      std::fstream::close();
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0);
      }
      std::fstream::~fstream((istream *)local_248);
      local_2e8 = local_2e8 + 1;
    } while( true );
  }
LAB_001dd8dd:
  if (threadID < (ulong)((long)DAT_002d1f88._M_current - (long)threadIDs >> 3)) {
    threadID = threadIDs[threadID];
  }
  local_248[0].__bits[0xe] = 0;
  local_248[0].__bits[0xf] = 0;
  local_248[0].__bits[0xc] = 0;
  local_248[0].__bits[0xd] = 0;
  local_248[0].__bits[10] = 0;
  local_248[0].__bits[0xb] = 0;
  local_248[0].__bits[8] = 0;
  local_248[0].__bits[9] = 0;
  local_248[0].__bits[6] = 0;
  local_248[0].__bits[7] = 0;
  local_248[0].__bits[4] = 0;
  local_248[0].__bits[5] = 0;
  local_248[0].__bits[2] = 0;
  local_248[0].__bits[3] = 0;
  local_248[0].__bits[0] = 0;
  local_248[0].__bits[1] = 0;
  __th = pthread_self();
  iVar5 = pthread_getaffinity_np(__th,0x80,local_248);
  uVar13 = threadID;
  if (iVar5 == 0) {
    uVar10 = 0;
    iVar5 = 0;
    do {
      if ((local_248[0].__bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
        uVar13 = uVar10;
        if (threadID == (long)iVar5) break;
        iVar5 = iVar5 + 1;
      }
      uVar10 = uVar10 + 1;
      uVar13 = threadID;
    } while (uVar10 != 0x400);
  }
  if (local_258 == '\x01') {
    MutexSys::unlock(local_260);
  }
  return uVar13;
LAB_001dd85b:
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  std::fstream::~fstream(local_248);
  threadID = local_250;
  if (DAT_002d1f88._M_current != threadIDs) {
    uVar10 = 0;
    puVar9 = DAT_002d1f88._M_current;
    do {
      if (puVar9 != threadIDs) {
        uVar11 = 0;
        do {
          if (((uVar10 != uVar11) && (puVar9 != threadIDs)) &&
             (threadIDs[uVar10] == threadIDs[uVar11])) {
            DAT_002d1f88._M_current = threadIDs;
            puVar9 = threadIDs;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)puVar9 - (long)threadIDs >> 3));
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)puVar9 - (long)threadIDs >> 3));
  }
  goto LAB_001dd8dd;
}

Assistant:

size_t mapThreadID(size_t threadID)
  {
    Lock<MutexSys> lock(mutex);
    
    if (threadIDs.size() == 0)
    {
      /* parse thread/CPU topology */
      for (size_t cpuID=0;;cpuID++)
      {
        std::fstream fs;
        std::string cpu = std::string("/sys/devices/system/cpu/cpu") + std::to_string((long long)cpuID) + std::string("/topology/thread_siblings_list");
        fs.open (cpu.c_str(), std::fstream::in);
        if (fs.fail()) break;

        int i;
        while (fs >> i) 
        {
          if (std::none_of(threadIDs.begin(),threadIDs.end(),[&] (int id) { return id == i; }))
            threadIDs.push_back(i);
          if (fs.peek() == ',') 
            fs.ignore();
        }
        fs.close();
      }

#if 0
      for (size_t i=0;i<threadIDs.size();i++)
        std::cout << i << " -> " << threadIDs[i] << std::endl;
#endif

      /* verify the mapping and do not use it if the mapping has errors */
      for (size_t i=0;i<threadIDs.size();i++) {
        for (size_t j=0;j<threadIDs.size();j++) {
          if (i != j && threadIDs[i] == threadIDs[j]) {
            threadIDs.clear();
          }
        }
      }
    }

    /* re-map threadIDs if mapping is available */
    size_t ID = threadID;
    if (threadID < threadIDs.size())
      ID = threadIDs[threadID];

    /* find correct thread to affinitize to */
    cpu_set_t set;
    CPU_ZERO(&set);
    
    if (pthread_getaffinity_np(pthread_self(), sizeof(set), &set) == 0)
    {
      for (int i=0, j=0; i<CPU_SETSIZE; i++)
      {
        if (!CPU_ISSET(i,&set)) continue;

        if (j == ID) {
          ID = i;
          break;
        }
        j++;
      }
    }

    return ID;
  }